

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O0

void ParsePhdr(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  SFPreset *pSVar5;
  int local_2c;
  SFPreset *pSStack_28;
  int i;
  SFPreset *preset;
  DWORD chunklen_local;
  DWORD chunkid_local;
  FileReader *f_local;
  SFFile *sf2_local;
  
  if ((0x4b < chunklen) && (chunklen % 0x26 == 0)) {
    sf2->NumPresets = chunklen / 0x26;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)sf2->NumPresets;
    uVar4 = SUB168(auVar1 * ZEXT816(0x1c),0);
    if (SUB168(auVar1 * ZEXT816(0x1c),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    pSVar5 = (SFPreset *)operator_new__(uVar4);
    sf2->Presets = pSVar5;
    pSStack_28 = sf2->Presets;
    local_2c = sf2->NumPresets;
    while( true ) {
      if (local_2c == 0) {
        return;
      }
      read_name(f,pSStack_28->Name);
      iVar2 = read_uword(f);
      pSStack_28->Program = (WORD)iVar2;
      iVar2 = read_uword(f);
      pSStack_28->Bank = (WORD)iVar2;
      iVar2 = read_uword(f);
      pSStack_28->BagIndex = (WORD)iVar2;
      skip_chunk(f,0xc);
      if ((pSStack_28 != sf2->Presets) && (pSStack_28->BagIndex < pSStack_28[-1].BagIndex)) break;
      local_2c = local_2c + -1;
      pSStack_28 = pSStack_28 + 1;
    }
    uVar3 = __cxa_allocate_exception(1);
    __cxa_throw(uVar3,&CBadForm::typeinfo,0);
  }
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&CBadForm::typeinfo,0);
}

Assistant:

static void ParsePhdr(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFPreset *preset;

	// Section 7.2, page 22:
	//		If the PHDR sub-chunk is missing, or contains fewer than two records,
	//		or its size is not a multiple of 38 bytes, the file should be rejected
	//		as structurally unsound.
	if (chunklen < 38*2 || chunklen % 38 != 0)
	{
		throw CBadForm();
	}

	sf2->NumPresets = chunklen / 38;
	sf2->Presets = new SFPreset[sf2->NumPresets];
	preset = sf2->Presets;

	for (int i = sf2->NumPresets; i != 0; --i, ++preset)
	{
		read_name(f, preset->Name);
		preset->Program = read_uword(f);
		preset->Bank = read_uword(f);
		preset->BagIndex = read_uword(f);
		skip_chunk(f, 4*3);	// Skip library, genre, and morphology

		// Section 7.2, page 22:
		//		The preset bag indices will be monotonically increasing with
		//		increasing preset headers.
		if (preset != sf2->Presets)
		{
			if (preset->BagIndex < (preset - 1)->BagIndex)
			{
				throw CBadForm();
			}
		}
	}
}